

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O3

shared_ptr<mnf::Manifold> __thiscall
mnf::SO3<mnf::ExpMapQuaternion>::getNewCopy_(SO3<mnf::ExpMapQuaternion> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double dVar4;
  SO3<mnf::ExpMapQuaternion> *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<mnf::Manifold> sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  __p = (SO3<mnf::ExpMapQuaternion> *)operator_new(0xa0);
  *(undefined8 *)&__p->field_0x8 = 0x677d725700000000;
  *(undefined **)__p = &std::bad_alloc::typeinfo;
  *(undefined8 *)&__p->field_0x10 = *(undefined8 *)(in_RSI + 0x10);
  *(undefined1 **)&__p->field_0x18 = &__p->field_0x28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__p->field_0x18,*(long *)(in_RSI + 0x18),
             *(long *)(in_RSI + 0x20) + *(long *)(in_RSI + 0x18));
  uVar1 = *(undefined8 *)(in_RSI + 0x38);
  uVar2 = *(undefined8 *)(in_RSI + 0x40);
  uVar3 = *(undefined8 *)(in_RSI + 0x49);
  *(undefined8 *)&__p->field_0x41 = *(undefined8 *)(in_RSI + 0x41);
  *(undefined8 *)&__p->field_0x49 = uVar3;
  *(undefined8 *)&__p->field_0x38 = uVar1;
  *(undefined8 *)&__p->field_0x40 = uVar2;
  *(undefined ***)__p = &PTR__SO3_001148e0;
  mnf::ReusableTemporaryMap::ReusableTemporaryMap
            (&__p->bufferMap_,(ReusableTemporaryMap *)(in_RSI + 0x58));
  (__p->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = *(double *)(in_RSI + 0x80);
  dVar4 = *(double *)(in_RSI + 0x78);
  (__p->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = *(double *)(in_RSI + 0x70);
  (__p->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = dVar4;
  dVar4 = *(double *)(in_RSI + 0x90);
  (__p->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = *(double *)(in_RSI + 0x88);
  (__p->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = dVar4;
  (__p->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = *(double *)(in_RSI + 0x98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mnf::SO3<mnf::ExpMapQuaternion>*>
            (a_Stack_30,__p);
  *(SO3<mnf::ExpMapQuaternion> **)this = __p;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8 = a_Stack_30[0]._M_pi;
  sVar5.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar5.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> SO3<Map>::getNewCopy_() const
{
  std::shared_ptr<SO3<Map> > copySO3(new SO3<Map>(*this));
  return copySO3;
}